

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O1

void __thiscall CircBufTest::thread1main(CircBufTest *this)

{
  CircularBuffer *pCVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  uint8_t dumpBuf [128];
  uint8_t buf [128];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  char local_b8 [136];
  
  pcVar4 = local_b8;
  builtin_strncpy(local_b8,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                  ,0x80);
  local_138 = 0x1414141414141414;
  uStack_130 = 0x1414141414141414;
  local_128 = 0x1414141414141414;
  uStack_120 = 0x1414141414141414;
  local_118 = 0x1414141414141414;
  uStack_110 = 0x1414141414141414;
  local_108 = 0x1414141414141414;
  uStack_100 = 0x1414141414141414;
  local_f8 = 0x1414141414141414;
  uStack_f0 = 0x1414141414141414;
  local_e8 = 0x1414141414141414;
  uStack_e0 = 0x1414141414141414;
  local_d8 = 0x1414141414141414;
  uStack_d0 = 0x1414141414141414;
  local_c8 = 0x1414141414141414;
  uStack_c0 = 0x1414141414141414;
  pCVar1 = &this->gbuff;
  Mutex::Lock();
  iVar2 = JetHead::CircularBuffer::getLength();
  JetHead::CircularBuffer::write((uchar *)pCVar1,(int)pcVar4);
  JetHead::CircularBuffer::getLength();
  JetHead::CircularBuffer::copy((uchar *)pCVar1,(int)&local_138);
  lVar3 = (long)iVar2 + -1;
  do {
    if (*pcVar4 != *(char *)((long)&local_138 + lVar3 + 1)) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                 ,0x331,"Lock doesn\'t work.");
    }
    lVar3 = lVar3 + 1;
    pcVar4 = pcVar4 + 1;
  } while (lVar3 < iVar2 + 0x3f);
  Mutex::Unlock();
  iVar2 = JetHead::CircularBuffer::waitForData((int)pCVar1,0x80);
  if (iVar2 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x338,"waitForData might be broken.");
  }
  JetHead::CircularBuffer::clear();
  return;
}

Assistant:

void CircBufTest::thread1main()
{
	uint8_t buf[BUFFER_SIZE];
	uint8_t dumpBuf[BUFFER_SIZE];

	fill(buf, buf + BUFFER_SIZE, 1);
	fill(dumpBuf, dumpBuf + BUFFER_SIZE, 20);

	gbuff.Lock();

	int offset = gbuff.getLength();


	gbuff.write(buf, BUFFER_SIZE / 2);

	gbuff.copy(dumpBuf, gbuff.getLength());

	for( int i = 0 + offset; i < ( offset + (BUFFER_SIZE / 2)); i++)
		if( buf[i - offset] != dumpBuf[i] )
			TestFailed("Lock doesn't work.");


	gbuff.Unlock();

	// Wait till the other guy fills it up, or if I fill it up keep going.
	if( !gbuff.waitForData(BUFFER_SIZE, 1000))
		TestFailed("waitForData might be broken.");

	gbuff.clear();

}